

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  rep rVar1;
  int64_t iVar2;
  int *piVar3;
  element_type *peVar4;
  undefined8 uVar5;
  id iVar6;
  int iVar7;
  long lVar8;
  exception_ptr exception;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_68;
  timespec local_60;
  id local_50;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar1;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  local_60.tv_sec = 0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(this->trainException_)._M_exception_object;
  (this->trainException_)._M_exception_object = (void *)0x0;
  if (local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
    if ((long *)local_60.tv_sec != (long *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thread) {
    iVar7 = 0;
    do {
      local_68._M_id._M_thread = (id)0;
      local_60.tv_sec = (__time_t)operator_new(0x18);
      *(undefined ***)local_60.tv_sec = &PTR___State_001469b0;
      *(FastText **)(local_60.tv_sec + 8) = this;
      *(int *)(local_60.tv_sec + 0x10) = iVar7;
      std::thread::_M_start_thread(&local_68,&local_60,0);
      if ((long *)local_60.tv_sec != (long *)0x0) {
        (**(code **)(*(long *)local_60.tv_sec + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_48,&local_68);
      if (local_68._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->thread);
  }
  iVar2 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6._M_thread = (native_handle_type)(this->trainException_)._M_exception_object;
  if ((void *)iVar6._M_thread == (void *)0x0 &&
      (this->tokenCount_).super___atomic_base<long>._M_i < peVar4->epoch * iVar2) {
    do {
      local_60.tv_sec = 0;
      local_60.tv_nsec = 100000000;
      do {
        iVar7 = nanosleep(&local_60,&local_60);
        if (iVar7 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if ((0.0 <= (this->loss_)._M_i) &&
         (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->verbose)) {
        lVar8 = (this->tokenCount_).super___atomic_base<long>._M_i;
        iVar7 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->epoch;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
        printInfo(this,(float)lVar8 / (float)(iVar7 * iVar2),(this->loss_)._M_i,
                  (ostream *)&std::cerr);
      }
      peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6._M_thread = (native_handle_type)(this->trainException_)._M_exception_object;
    } while (((this->tokenCount_).super___atomic_base<long>._M_i < peVar4->epoch * iVar2) &&
            ((void *)iVar6._M_thread == (void *)0x0));
  }
  if (0 < peVar4->thread) {
    lVar8 = 0;
    do {
      std::thread::join();
      lVar8 = lVar8 + 1;
      peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while (lVar8 < peVar4->thread);
    iVar6._M_thread = (native_handle_type)(this->trainException_)._M_exception_object;
  }
  if ((void *)iVar6._M_thread == (void *)0x0) {
    if (0 < peVar4->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
      printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
    return;
  }
  local_68._M_id._M_thread = (id)(id)iVar6._M_thread;
  std::__exception_ptr::exception_ptr::_M_addref();
  local_60.tv_sec = (__time_t)(this->trainException_)._M_exception_object;
  (this->trainException_)._M_exception_object = (void *)0x0;
  if ((void *)local_60.tv_sec != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  local_50 = local_68._M_id._M_thread;
  if (local_68._M_id._M_thread != 0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar5 = std::rethrow_exception((exception_ptr)&local_50);
  if ((void *)local_50._M_thread != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_68._M_id._M_thread != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  _Unwind_Resume(uVar5);
}

Assistant:

void FastText::startThreads() {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < args_->thread; i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}